

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O1

void lognormal_init(rand_gen *gen,param_2 *param)

{
  cpp_gen *pcVar1;
  
  pcVar1 = new_normal_gen();
  (gen->params).lgp.ng = pcVar1;
  (gen->params).p2.b = param->a;
  (gen->params).p1.a = param->b;
  gen->generate = lognorm_generate;
  gen->set_avg = lognorm_set_avg;
  gen->inv_cdf = lognorm_inv_cdf;
  gen->gen_type = 0;
  free(param);
  return;
}

Assistant:

static void lognormal_init(struct rand_gen *gen, struct param_2 *param)
{

	gen->params.lgp.ng = new_normal_gen();
	gen->params.lgp.mu = param->a;
	gen->params.lgp.sigma = param->b;

	gen->generate = lognorm_generate;
	gen->set_avg = lognorm_set_avg;
	gen->inv_cdf = lognorm_inv_cdf;
	gen->gen_type = GEN_OTHER;
	free(param);
}